

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int ModifiedGS(N_Vector *v,realtype **h,int k,int p,realtype *new_vk_norm)

{
  realtype rVar1;
  double dVar2;
  int iVar3;
  double local_88;
  double local_80;
  double local_78;
  int local_6c;
  double local_68;
  realtype temp;
  realtype vk_norm;
  realtype new_product;
  realtype new_norm_2;
  int i0;
  int k_minus_1;
  int i;
  realtype *new_vk_norm_local;
  int p_local;
  int k_local;
  realtype **h_local;
  N_Vector *v_local;
  
  rVar1 = N_VDotProd(v[k],v[k]);
  if (0.0 < rVar1) {
    rVar1 = N_VDotProd(v[k],v[k]);
    local_68 = sqrt(rVar1);
  }
  else {
    local_68 = 0.0;
  }
  iVar3 = k + -1;
  if (k - p < 1) {
    local_6c = 0;
  }
  else {
    local_6c = k - p;
  }
  for (i0 = local_6c; i0 < k; i0 = i0 + 1) {
    rVar1 = N_VDotProd(v[i0],v[k]);
    h[i0][iVar3] = rVar1;
    N_VLinearSum(1.0,v[k],-h[i0][iVar3],v[i0],v[k]);
  }
  rVar1 = N_VDotProd(v[k],v[k]);
  if (0.0 < rVar1) {
    rVar1 = N_VDotProd(v[k],v[k]);
    local_78 = sqrt(rVar1);
  }
  else {
    local_78 = 0.0;
  }
  *new_vk_norm = local_78;
  local_68 = local_68 * 1000.0;
  if ((local_68 + *new_vk_norm == local_68) && (!NAN(local_68 + *new_vk_norm) && !NAN(local_68))) {
    new_product = 0.0;
    for (i0 = local_6c; i0 < k; i0 = i0 + 1) {
      rVar1 = N_VDotProd(v[i0],v[k]);
      dVar2 = h[i0][iVar3] * 1000.0;
      if ((dVar2 + rVar1 != dVar2) || (NAN(dVar2 + rVar1) || NAN(dVar2))) {
        h[i0][iVar3] = rVar1 + h[i0][iVar3];
        N_VLinearSum(1.0,v[k],-rVar1,v[i0],v[k]);
        new_product = rVar1 * rVar1 + new_product;
      }
    }
    if ((new_product != 0.0) || (NAN(new_product))) {
      dVar2 = *new_vk_norm * *new_vk_norm + -new_product;
      if (dVar2 <= 0.0) {
        local_88 = 0.0;
      }
      else {
        if (0.0 < dVar2) {
          local_80 = sqrt(dVar2);
        }
        else {
          local_80 = 0.0;
        }
        local_88 = local_80;
      }
      *new_vk_norm = local_88;
    }
  }
  return 0;
}

Assistant:

int ModifiedGS(N_Vector *v, realtype **h, int k, int p, 
               realtype *new_vk_norm)
{
  int  i, k_minus_1, i0;
  realtype new_norm_2, new_product, vk_norm, temp;
  
  vk_norm = SUNRsqrt(N_VDotProd(v[k],v[k]));
  k_minus_1 = k - 1;
  i0 = SUNMAX(k-p, 0);
  
  /* Perform modified Gram-Schmidt */
  
  for (i=i0; i < k; i++) {
    h[i][k_minus_1] = N_VDotProd(v[i], v[k]);
    N_VLinearSum(ONE, v[k], -h[i][k_minus_1], v[i], v[k]);
  }

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));

  /* If the norm of the new vector at v[k] is less than
     FACTOR (== 1000) times unit roundoff times the norm of the
     input vector v[k], then the vector will be reorthogonalized
     in order to ensure that nonorthogonality is not being masked
     by a very small vector length. */

  temp = FACTOR * vk_norm;
  if ((temp + (*new_vk_norm)) != temp) return(0);
  
  new_norm_2 = ZERO;

  for (i=i0; i < k; i++) {
    new_product = N_VDotProd(v[i], v[k]);
    temp = FACTOR * h[i][k_minus_1];
    if ((temp + new_product) == temp) continue;
    h[i][k_minus_1] += new_product;
    N_VLinearSum(ONE, v[k],-new_product, v[i], v[k]);
    new_norm_2 += SUNSQR(new_product);
  }

  if (new_norm_2 != ZERO) {
    new_product = SUNSQR(*new_vk_norm) - new_norm_2;
    *new_vk_norm = (new_product > ZERO) ? SUNRsqrt(new_product) : ZERO;
  }

  return(0);
}